

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void same_stl_string_pointer_and_reference_are_equal(void)

{
  string *psVar1;
  Constraint *constraint;
  allocator local_31;
  string alice_reference;
  
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar1,"alice",(allocator *)&alice_reference);
  alice_pointer_abi_cxx11_ = psVar1;
  std::__cxx11::string::string((string *)&alice_reference,"alice",&local_31);
  psVar1 = alice_pointer_abi_cxx11_;
  constraint = (Constraint *)
               cgreen::create_equal_to_string_constraint
                         ((string *)&alice_reference,"alice_reference");
  cgreen::assert_that_<std::__cxx11::string*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x92,"alice_pointer",psVar1,constraint);
  std::__cxx11::string::~string((string *)&alice_reference);
  return;
}

Assistant:

Ensure(same_stl_string_pointer_and_reference_are_equal) {
    alice_pointer = new std::string("alice");
    std::string alice_reference("alice");

    assert_that(alice_pointer, is_equal_to_string(alice_reference));
}